

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnDiskIndex.cpp
# Opt level: O3

vector<unsigned_long,_std::allocator<unsigned_long>_> * __thiscall
OnDiskIndex::read_run_offsets
          (vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
          OnDiskIndex *this)

{
  pointer __s;
  __off_t in_R8;
  value_type_conflict2 *__val;
  
  __s = (pointer)operator_new(0x8000008);
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_start = __s;
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = __s + 0x1000001;
  memset(__s,0,0x8000008);
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_finish = __s + 0x1000001;
  RawFile::pread(&this->ndxfile,(int)__s,(void *)0x8000008,this->index_size - 0x8000008,in_R8);
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint64_t> OnDiskIndex::read_run_offsets() const {
    std::vector<uint64_t> run_offsets(NUM_TRIGRAMS + 1);
    ndxfile.pread(run_offsets.data(), RUN_ARRAY_SIZE,
                  index_size - RUN_ARRAY_SIZE);
    return run_offsets;
}